

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

void __thiscall ParserProbModelXML::ReadAgents(ParserProbModelXML *this)

{
  xmlNodeSetPtr pxVar1;
  FactoredDecPOMDPDiscrete *this_00;
  xmlXPathObjectPtr pxVar2;
  long lVar3;
  char *this_01;
  ParserInterface local_50;
  xmlDocPtr local_40;
  
  this_01 = "/ProbModelXML/ProbNet/Agents/Agent";
  pxVar2 = GetNodesMatchingExpression
                     (this,(xmlChar *)"/ProbModelXML/ProbNet/Agents/Agent",(xmlNodePtr)0x0);
  if (((pxVar2 == (xmlXPathObjectPtr)0x0) || (this->_m_asynchronousModel != false)) ||
     (pxVar1 = pxVar2->nodesetval, pxVar1->nodeNr < 2)) {
    MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this->_m_fDecPOMDP,1);
  }
  else if (0 < pxVar1->nodeNr) {
    lVar3 = 0;
    do {
      this_00 = this->_m_fDecPOMDP;
      GetVariableName_abi_cxx11_
                ((string *)&stack0xffffffffffffffb0,(ParserProbModelXML *)this_01,
                 pxVar1->nodeTab[lVar3]);
      this_01 = (char *)&stack0xffffffffffffffb0;
      MultiAgentDecisionProcess::AddAgent
                ((MultiAgentDecisionProcess *)this_00,(string *)&stack0xffffffffffffffb0);
      if ((xmlDocPtr *)local_50._vptr_ParserInterface != &stack0xffffffffffffffc0) {
        this_01 = (char *)(local_40 + 1);
        operator_delete(local_50._vptr_ParserInterface,(ulong)this_01);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pxVar1->nodeNr);
  }
  xmlXPathFreeObject(pxVar2);
  this->_m_agentsInitialized = true;
  return;
}

Assistant:

void ParserProbModelXML::ReadAgents()
{
    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Agents/Agent";
    xmlXPathObjectPtr agent_nodes = GetNodesMatchingExpression(xpath);

    if (_m_asynchronousModel || agent_nodes == NULL || agent_nodes->nodesetval->nodeNr < 2){
        _m_fDecPOMDP->SetNrAgents(1);
        xmlXPathFreeObject (agent_nodes);
        _m_agentsInitialized = true;
        return;
    }
    xmlNodeSetPtr nodeset = agent_nodes->nodesetval;
    for (int i = 0; i < nodeset->nodeNr; i++) {
      _m_fDecPOMDP->AddAgent(GetVariableName(nodeset->nodeTab[i]));
    }
    xmlXPathFreeObject (agent_nodes);
    _m_agentsInitialized = true;
    return;
}